

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_epoch.h
# Opt level: O2

void neatlib::epoch::
     MemoryEpoch<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>,_neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>
     ::delete_callback(IAsyncContext *ctxt)

{
  long lVar1;
  uint32_t uVar2;
  CallbackContext<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_>
  context;
  
  FASTER::core::
  CallbackContext<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_>
  ::CallbackContext(&context,ctxt);
  uVar2 = FASTER::core::Thread::id();
  lVar1 = **(long **)((long)context.context_._M_t.
                            super___uniq_ptr_impl<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>,_FASTER::core::ContextDeleter<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_*,_FASTER::core::ContextDeleter<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_>_>
                            .
                            super__Head_base<0UL,_neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_*,_false>
                            ._M_head_impl + 0x18);
  if ((ulong)uVar2 <=
      (ulong)((*(long **)((long)context.context_._M_t.
                                super___uniq_ptr_impl<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>,_FASTER::core::ContextDeleter<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_*,_FASTER::core::ContextDeleter<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_>_>
                                .
                                super__Head_base<0UL,_neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_*,_false>
                                ._M_head_impl + 0x18))[1] - lVar1 >> 4)) {
    NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>
    ::Push((NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>
            *)(lVar1 + (ulong)uVar2 * 0x10),
           *(DataNode **)
            ((long)context.context_._M_t.
                   super___uniq_ptr_impl<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>,_FASTER::core::ContextDeleter<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_*,_FASTER::core::ContextDeleter<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_>_>
                   .
                   super__Head_base<0UL,_neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_*,_false>
                   ._M_head_impl + 0x10));
    FASTER::core::
    CallbackContext<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_>
    ::~CallbackContext(&context);
    return;
  }
  __assert_fail("tid <= context->pool->size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/huangjiahua[P]neatlib/./epoch/memory_epoch.h"
                ,0x29,
                "static void neatlib::epoch::MemoryEpoch<neatlib::LockFreeHashTable<unsigned long, unsigned long, std::hash<unsigned long>, 4, 8>::Node, std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned long, unsigned long, std::hash<unsigned long>, 4, 8>::DataNode>>, neatlib::LockFreeHashTable<unsigned long, unsigned long, std::hash<unsigned long>, 4, 8>::DataNode>::delete_callback(FASTER::core::IAsyncContext *) [T = neatlib::LockFreeHashTable<unsigned long, unsigned long, std::hash<unsigned long>, 4, 8>::Node, Pool = std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned long, unsigned long, std::hash<unsigned long>, 4, 8>::DataNode>>, Org = neatlib::LockFreeHashTable<unsigned long, unsigned long, std::hash<unsigned long>, 4, 8>::DataNode]"
               );
}

Assistant:

static void delete_callback(FASTER::core::IAsyncContext *ctxt) {
        FASTER::core::CallbackContext<Delete_Context<T, Pool>> context(ctxt);
        uint32_t tid = FASTER::core::Thread::id();
        assert(tid <= context->pool->size());
        auto &queue = context->pool->operator[](tid);
        queue.Push(static_cast<Org*>(context->ptr));
    }